

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURL_conflict ** curl_multi_get_handles(Curl_multi *multi)

{
  CURL_conflict **ppCVar1;
  CURL_conflict *local_28;
  Curl_easy *e;
  uint i;
  Curl_easy **a;
  Curl_multi *multi_local;
  
  ppCVar1 = (CURL_conflict **)(*Curl_cmalloc)((ulong)(multi->num_easy + 1) << 3);
  if (ppCVar1 != (CURL_conflict **)0x0) {
    e._4_4_ = 0;
    for (local_28 = multi->easyp; local_28 != (CURL_conflict *)0x0; local_28 = local_28->next) {
      if ((*(uint *)&(local_28->state).field_0x74c >> 0x15 & 1) == 0) {
        ppCVar1[e._4_4_] = local_28;
        e._4_4_ = e._4_4_ + 1;
      }
    }
    ppCVar1[e._4_4_] = (CURL_conflict *)0x0;
  }
  return ppCVar1;
}

Assistant:

struct Curl_easy **curl_multi_get_handles(struct Curl_multi *multi)
{
  struct Curl_easy **a = malloc(sizeof(struct Curl_easy *) *
                                (multi->num_easy + 1));
  if(a) {
    unsigned int i = 0;
    struct Curl_easy *e = multi->easyp;
    while(e) {
      DEBUGASSERT(i < multi->num_easy);
      if(!e->state.internal)
        a[i++] = e;
      e = e->next;
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}